

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

array<float,_4> __thiscall pbrt::HairBxDF::ComputeApPDF(HairBxDF *this,Float cosTheta_o)

{
  undefined1 auVar1 [16];
  float x;
  ulong uVar2;
  SampledSpectrum *__return_storage_ptr__;
  int i;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Float FVar6;
  undefined1 in_register_00001204 [60];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  SampledSpectrum SVar19;
  array<float,_4> aVar20;
  array<float,_4> apPDF;
  SampledSpectrum T;
  array<pbrt::SampledSpectrum,_4> ap;
  float local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  SampledSpectrum local_70;
  SampledSpectrum local_60;
  SampledSpectrum local_50 [4];
  undefined1 auVar21 [12];
  undefined1 auVar11 [56];
  undefined8 uVar22;
  undefined1 auVar16 [56];
  
  auVar7._4_60_ = in_register_00001204;
  auVar7._0_4_ = cosTheta_o;
  local_98 = 0.0;
  auVar1._0_4_ = this->h;
  auVar1._4_4_ = this->gamma_o;
  auVar1._8_4_ = this->eta;
  auVar1._12_4_ = (this->sigma_a).values.values[0];
  auVar4 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar7._0_16_,auVar7._0_16_);
  auVar4 = vmaxss_avx(auVar4,ZEXT816(0) << 0x40);
  auVar5 = vsqrtss_avx(auVar4,auVar4);
  FVar6 = this->eta;
  auVar4 = vfmsub231ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar5._0_4_)),ZEXT416((uint)FVar6),
                           ZEXT416((uint)FVar6));
  auVar4 = vmaxss_avx(auVar4,ZEXT816(0) << 0x40);
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  auVar17._0_4_ = auVar4._0_4_ / cosTheta_o;
  auVar17._4_12_ = auVar4._4_12_;
  auVar1 = vinsertps_avx(auVar1,auVar5,0x10);
  auVar4 = vinsertps_avx(auVar17,ZEXT416((uint)FVar6),0x10);
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  auVar1 = vdivps_avx(auVar1,auVar4);
  x = auVar1._0_4_;
  auVar12._0_4_ = x * x;
  auVar12._4_4_ = auVar1._4_4_ * auVar1._4_4_;
  auVar12._8_4_ = auVar1._8_4_ * auVar1._8_4_;
  auVar12._12_4_ = auVar1._12_4_ * auVar1._12_4_;
  auVar4 = vsubps_avx(auVar18,auVar12);
  uVar2 = vcmpps_avx512vl(ZEXT816(0),auVar4,1);
  auVar1 = vmovshdup_avx(auVar4);
  auVar4._0_4_ = (uint)((byte)uVar2 & 1) * auVar4._0_4_;
  auVar5._4_12_ = auVar1._4_12_;
  auVar5._0_4_ = (uint)((byte)(uVar2 >> 1) & 1) * auVar1._0_4_;
  auVar1 = vsqrtss_avx(auVar4,auVar4);
  auVar16 = ZEXT856(auVar1._8_8_);
  auVar4 = vsqrtss_avx(auVar5,auVar5);
  SafeASin(x);
  auVar11 = extraout_var;
  SVar19 = SampledSpectrum::operator-(&this->sigma_a);
  auVar13._0_8_ = SVar19.values.values._8_8_;
  auVar13._8_56_ = auVar16;
  auVar8._0_8_ = SVar19.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar13._0_16_);
  auVar11 = ZEXT856(0);
  SVar19 = SampledSpectrum::operator*(&local_70,(auVar1._0_4_ + auVar1._0_4_) / auVar4._0_4_);
  auVar14._0_8_ = SVar19.values.values._8_8_;
  auVar14._8_56_ = auVar16;
  auVar9._0_8_ = SVar19.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  local_50[0].values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
  auVar11 = ZEXT856(local_50[0].values.values._8_8_);
  SVar19 = Exp(local_50);
  auVar15._0_8_ = SVar19.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar10._0_8_ = SVar19.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  local_60.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar15._0_16_);
  __return_storage_ptr__ = local_50;
  Ap((array<pbrt::SampledSpectrum,_4> *)__return_storage_ptr__,cosTheta_o,this->eta,this->h,
     &local_60);
  local_88 = 0;
  uStack_80 = 0;
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x10) {
    FVar6 = SampledSpectrum::Average((SampledSpectrum *)((long)local_50[0].values.values + lVar3));
    local_98 = local_98 + FVar6;
  }
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    FVar6 = SampledSpectrum::Average(__return_storage_ptr__);
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
    *(float *)((long)&local_88 + lVar3 * 4) = FVar6 / local_98;
  }
  aVar20.values[0] = (float)(undefined4)local_88;
  auVar21._4_4_ = (float)local_88._4_4_;
  register0x00001240 = (float)(undefined4)uStack_80;
  register0x00001244 = (float)uStack_80._4_4_;
  return (array<float,_4>)aVar20.values;
}

Assistant:

pstd::array<Float, HairBxDF::pMax + 1> HairBxDF::ComputeApPDF(Float cosTheta_o) const {
    // Compute array of $A_p$ values for _cosThetaO_
    Float sinTheta_o = SafeSqrt(1 - cosTheta_o * cosTheta_o);
    // Compute $\cos \thetat$ for refracted ray
    Float sinTheta_t = sinTheta_o / eta;
    Float cosTheta_t = SafeSqrt(1 - Sqr(sinTheta_t));

    // Compute $\gammat$ for refracted ray
    Float etap = SafeSqrt(eta * eta - Sqr(sinTheta_o)) / cosTheta_o;
    Float sinGamma_t = h / etap;
    Float cosGamma_t = SafeSqrt(1 - Sqr(sinGamma_t));
    Float gamma_t = SafeASin(sinGamma_t);

    // Compute the transmittance _T_ of a single path through the cylinder
    SampledSpectrum T = Exp(-sigma_a * (2 * cosGamma_t / cosTheta_t));

    pstd::array<SampledSpectrum, pMax + 1> ap = Ap(cosTheta_o, eta, h, T);

    // Compute $A_p$ PDF from individual $A_p$ terms
    pstd::array<Float, pMax + 1> apPDF;
    Float sumY = 0;
    for (const SampledSpectrum &as : ap)
        sumY += as.Average();
    for (int i = 0; i <= pMax; ++i)
        apPDF[i] = ap[i].Average() / sumY;

    return apPDF;
}